

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O0

void __thiscall ExternalTester::ExternalTester(ExternalTester *this,int in_num_mc)

{
  allocator<TasGrid::TypeAcceleration> *this_00;
  initializer_list<TestType> __l;
  initializer_list<TestType> __l_00;
  initializer_list<TestType> __l_01;
  initializer_list<TasGrid::TypeAcceleration> __l_02;
  bool bVar1;
  reference pTVar2;
  size_type sVar3;
  size_type sVar4;
  iterator iVar5;
  iterator iVar6;
  back_insert_iterator<std::vector<TestType,_std::allocator<TestType>_>_> bVar7;
  size_type sVar8;
  TestType local_e0 [2];
  iterator local_d8;
  undefined8 local_d0;
  TestType local_c8 [2];
  iterator local_c0;
  undefined8 local_b8;
  TestType local_ac;
  iterator local_a8;
  undefined8 local_a0;
  TypeAcceleration local_94;
  iterator iStack_90;
  TypeAcceleration acc;
  iterator __end1;
  iterator __begin1;
  TypeAcceleration local_78 [8];
  iterator local_58;
  size_type local_50;
  vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_> local_48;
  vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_> *local_30;
  vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_> *__range1;
  int local_14;
  ExternalTester *pEStack_10;
  int in_num_mc_local;
  ExternalTester *this_local;
  
  this->num_mc = in_num_mc;
  this->verbose = false;
  this->gpuid = -1;
  local_14 = in_num_mc;
  pEStack_10 = this;
  std::vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>::vector
            (&this->available_acc);
  std::vector<TestType,_std::allocator<TestType>_>::vector(&this->quad_only);
  std::vector<TestType,_std::allocator<TestType>_>::vector(&this->int_only);
  std::vector<TestType,_std::allocator<TestType>_>::vector(&this->diff_only);
  std::vector<TestType,_std::allocator<TestType>_>::vector(&this->quad_int);
  std::vector<TestType,_std::allocator<TestType>_>::vector(&this->quad_diff);
  std::vector<TestType,_std::allocator<TestType>_>::vector(&this->int_diff);
  std::vector<TestType,_std::allocator<TestType>_>::vector(&this->all_test_types);
  OneOneP0::OneOneP0(&this->f11p0);
  OneOneP3::OneOneP3(&this->f11p3);
  TwoOneExpNX2::TwoOneExpNX2(&this->f21nx2);
  TwoOneCos::TwoOneCos(&this->f21cos);
  TwoOneSinSin::TwoOneSinSin(&this->f21sinsin);
  TwoOneCosCos::TwoOneCosCos(&this->f21coscos);
  TwoOneExpSinCos::TwoOneExpSinCos(&this->f21expsincos);
  TwoOneSinCosAxis::TwoOneSinCosAxis(&this->f21sincosaxis);
  TwoTwoSinCos::TwoTwoSinCos(&this->f22sincos);
  TwoOneDivisionAnisotropic::TwoOneDivisionAnisotropic(&this->f21aniso);
  TwoOne1DCurved::TwoOne1DCurved(&this->f21curved);
  TwoOneExpm40::TwoOneExpm40(&this->f21sharp);
  TwoOneConstGC1::TwoOneConstGC1(&this->f21constGC1);
  TwoOneConstGC2::TwoOneConstGC2(&this->f21constGC2);
  TwoOneConstGG::TwoOneConstGG(&this->f21constGG);
  TwoOneConstGJ::TwoOneConstGJ(&this->f21constGJ);
  TwoOneConstGGL::TwoOneConstGGL(&this->f21constGGL);
  TwoOneConstGH::TwoOneConstGH(&this->f21constGH);
  TwoOneENX2aniso::TwoOneENX2aniso(&this->f21nx2aniso);
  TwoTwoExpAsym::TwoTwoExpAsym(&this->f22asym);
  TwoOneExpShiftedDomain::TwoOneExpShiftedDomain(&this->f21expDomain);
  TwoOneConformalOne::TwoOneConformalOne(&this->f21conformal);
  SixteenOneActive3::SixteenOneActive3(&this->f16active3);
  Two3KExpSinCos::Two3KExpSinCos(&this->f23Kexpsincos);
  TwoOneC1C2Periodic::TwoOneC1C2Periodic(&this->f21c1c2periodic);
  local_78[0] = accel_none;
  local_78[1] = accel_cpu_blas;
  local_78[2] = accel_gpu_cublas;
  local_78[3] = accel_gpu_cuda;
  local_78[4] = 5;
  local_58 = local_78;
  local_50 = 5;
  this_00 = (allocator<TasGrid::TypeAcceleration> *)((long)&__begin1._M_current + 7);
  std::allocator<TasGrid::TypeAcceleration>::allocator(this_00);
  __l_02._M_len = local_50;
  __l_02._M_array = local_58;
  std::vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>::vector
            (&local_48,__l_02,this_00);
  std::allocator<TasGrid::TypeAcceleration>::~allocator
            ((allocator<TasGrid::TypeAcceleration> *)((long)&__begin1._M_current + 7));
  local_30 = &local_48;
  __end1 = std::vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>::begin
                     (local_30);
  iStack_90 = std::vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>::
              end(local_30);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff70), bVar1) {
    pTVar2 = __gnu_cxx::
             __normal_iterator<TasGrid::TypeAcceleration_*,_std::vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>_>
             ::operator*(&__end1);
    local_94 = *pTVar2;
    bVar1 = TasGrid::AccelerationMeta::isAvailable(local_94);
    if (bVar1) {
      std::vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>::push_back
                (&this->available_acc,&local_94);
    }
    __gnu_cxx::
    __normal_iterator<TasGrid::TypeAcceleration_*,_std::vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>_>
    ::operator++(&__end1);
  }
  std::vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>::~vector
            (&local_48);
  local_ac = type_integration;
  local_a8 = &local_ac;
  local_a0 = 1;
  __l_01._M_len = 1;
  __l_01._M_array = local_a8;
  std::vector<TestType,_std::allocator<TestType>_>::operator=(&this->quad_only,__l_01);
  local_c8[0] = type_nodal_interpolation;
  local_c8[1] = 3;
  local_c0 = local_c8;
  local_b8 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_c0;
  std::vector<TestType,_std::allocator<TestType>_>::operator=(&this->int_only,__l_00);
  local_e0[0] = type_nodal_differentiation;
  local_e0[1] = 4;
  local_d8 = local_e0;
  local_d0 = 2;
  __l._M_len = 2;
  __l._M_array = local_d8;
  std::vector<TestType,_std::allocator<TestType>_>::operator=(&this->diff_only,__l);
  sVar3 = std::vector<TestType,_std::allocator<TestType>_>::size(&this->quad_only);
  sVar4 = std::vector<TestType,_std::allocator<TestType>_>::size(&this->int_only);
  std::vector<TestType,_std::allocator<TestType>_>::reserve(&this->quad_int,sVar3 + sVar4);
  iVar5 = std::vector<TestType,_std::allocator<TestType>_>::begin(&this->quad_only);
  iVar6 = std::vector<TestType,_std::allocator<TestType>_>::end(&this->quad_only);
  bVar7 = std::back_inserter<std::vector<TestType,std::allocator<TestType>>>(&this->quad_int);
  std::
  copy<__gnu_cxx::__normal_iterator<TestType*,std::vector<TestType,std::allocator<TestType>>>,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar5._M_current,
             (__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar6._M_current,bVar7);
  iVar5 = std::vector<TestType,_std::allocator<TestType>_>::begin(&this->int_only);
  iVar6 = std::vector<TestType,_std::allocator<TestType>_>::end(&this->int_only);
  bVar7 = std::back_inserter<std::vector<TestType,std::allocator<TestType>>>(&this->quad_int);
  std::
  copy<__gnu_cxx::__normal_iterator<TestType*,std::vector<TestType,std::allocator<TestType>>>,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar5._M_current,
             (__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar6._M_current,bVar7);
  sVar3 = std::vector<TestType,_std::allocator<TestType>_>::size(&this->quad_only);
  sVar4 = std::vector<TestType,_std::allocator<TestType>_>::size(&this->diff_only);
  std::vector<TestType,_std::allocator<TestType>_>::reserve(&this->quad_diff,sVar3 + sVar4);
  iVar5 = std::vector<TestType,_std::allocator<TestType>_>::begin(&this->quad_only);
  iVar6 = std::vector<TestType,_std::allocator<TestType>_>::end(&this->quad_only);
  bVar7 = std::back_inserter<std::vector<TestType,std::allocator<TestType>>>(&this->quad_diff);
  std::
  copy<__gnu_cxx::__normal_iterator<TestType*,std::vector<TestType,std::allocator<TestType>>>,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar5._M_current,
             (__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar6._M_current,bVar7);
  iVar5 = std::vector<TestType,_std::allocator<TestType>_>::begin(&this->diff_only);
  iVar6 = std::vector<TestType,_std::allocator<TestType>_>::end(&this->diff_only);
  bVar7 = std::back_inserter<std::vector<TestType,std::allocator<TestType>>>(&this->quad_diff);
  std::
  copy<__gnu_cxx::__normal_iterator<TestType*,std::vector<TestType,std::allocator<TestType>>>,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar5._M_current,
             (__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar6._M_current,bVar7);
  sVar3 = std::vector<TestType,_std::allocator<TestType>_>::size(&this->int_only);
  sVar4 = std::vector<TestType,_std::allocator<TestType>_>::size(&this->diff_only);
  std::vector<TestType,_std::allocator<TestType>_>::reserve(&this->int_diff,sVar3 + sVar4);
  iVar5 = std::vector<TestType,_std::allocator<TestType>_>::begin(&this->int_only);
  iVar6 = std::vector<TestType,_std::allocator<TestType>_>::end(&this->int_only);
  bVar7 = std::back_inserter<std::vector<TestType,std::allocator<TestType>>>(&this->int_diff);
  std::
  copy<__gnu_cxx::__normal_iterator<TestType*,std::vector<TestType,std::allocator<TestType>>>,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar5._M_current,
             (__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar6._M_current,bVar7);
  iVar5 = std::vector<TestType,_std::allocator<TestType>_>::begin(&this->diff_only);
  iVar6 = std::vector<TestType,_std::allocator<TestType>_>::end(&this->diff_only);
  bVar7 = std::back_inserter<std::vector<TestType,std::allocator<TestType>>>(&this->int_diff);
  std::
  copy<__gnu_cxx::__normal_iterator<TestType*,std::vector<TestType,std::allocator<TestType>>>,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar5._M_current,
             (__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar6._M_current,bVar7);
  sVar3 = std::vector<TestType,_std::allocator<TestType>_>::size(&this->quad_only);
  sVar4 = std::vector<TestType,_std::allocator<TestType>_>::size(&this->int_only);
  sVar8 = std::vector<TestType,_std::allocator<TestType>_>::size(&this->diff_only);
  std::vector<TestType,_std::allocator<TestType>_>::reserve
            (&this->all_test_types,sVar3 + sVar4 + sVar8);
  iVar5 = std::vector<TestType,_std::allocator<TestType>_>::begin(&this->quad_only);
  iVar6 = std::vector<TestType,_std::allocator<TestType>_>::end(&this->quad_only);
  bVar7 = std::back_inserter<std::vector<TestType,std::allocator<TestType>>>(&this->all_test_types);
  std::
  copy<__gnu_cxx::__normal_iterator<TestType*,std::vector<TestType,std::allocator<TestType>>>,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar5._M_current,
             (__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar6._M_current,bVar7);
  iVar5 = std::vector<TestType,_std::allocator<TestType>_>::begin(&this->int_only);
  iVar6 = std::vector<TestType,_std::allocator<TestType>_>::end(&this->int_only);
  bVar7 = std::back_inserter<std::vector<TestType,std::allocator<TestType>>>(&this->all_test_types);
  std::
  copy<__gnu_cxx::__normal_iterator<TestType*,std::vector<TestType,std::allocator<TestType>>>,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar5._M_current,
             (__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar6._M_current,bVar7);
  iVar5 = std::vector<TestType,_std::allocator<TestType>_>::begin(&this->diff_only);
  iVar6 = std::vector<TestType,_std::allocator<TestType>_>::end(&this->diff_only);
  bVar7 = std::back_inserter<std::vector<TestType,std::allocator<TestType>>>(&this->all_test_types);
  std::
  copy<__gnu_cxx::__normal_iterator<TestType*,std::vector<TestType,std::allocator<TestType>>>,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar5._M_current,
             (__normal_iterator<TestType_*,_std::vector<TestType,_std::allocator<TestType>_>_>)
             iVar6._M_current,bVar7);
  return;
}

Assistant:

ExternalTester::ExternalTester(int in_num_mc) : num_mc(in_num_mc), verbose(false), gpuid(-1) {
    for(auto acc : std::vector<TypeAcceleration>{accel_none, accel_cpu_blas, accel_gpu_cublas, accel_gpu_cuda, accel_gpu_magma}){
        if (AccelerationMeta::isAvailable(acc)) available_acc.push_back(acc);
    }
    #ifdef Tasmanian_ENABLE_DPCPP
    test_queue.init_testing(gpuid);
    #endif
    // Hardcoded test types.
    quad_only = {type_integration};
    int_only = {type_nodal_interpolation, type_internal_interpolation};
    diff_only = {type_nodal_differentiation, type_internal_differentiation};
    quad_int.reserve(quad_only.size() + int_only.size());
    std::copy(quad_only.begin(), quad_only.end(), std::back_inserter(quad_int));
    std::copy(int_only.begin(), int_only.end(), std::back_inserter(quad_int));
    quad_diff.reserve(quad_only.size() + diff_only.size());
    std::copy(quad_only.begin(), quad_only.end(), std::back_inserter(quad_diff));
    std::copy(diff_only.begin(), diff_only.end(), std::back_inserter(quad_diff));
    int_diff.reserve(int_only.size() + diff_only.size());
    std::copy(int_only.begin(), int_only.end(), std::back_inserter(int_diff));
    std::copy(diff_only.begin(), diff_only.end(), std::back_inserter(int_diff));
    all_test_types.reserve(quad_only.size() + int_only.size() + diff_only.size());
    std::copy(quad_only.begin(), quad_only.end(), std::back_inserter(all_test_types));
    std::copy(int_only.begin(), int_only.end(), std::back_inserter(all_test_types));
    std::copy(diff_only.begin(), diff_only.end(), std::back_inserter(all_test_types));
}